

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::M3DImporter::importTextures(M3DImporter *this,M3DWrapper *m3d)

{
  char *__s;
  undefined1 auVar1 [16];
  bool bVar2;
  m3d_t *pmVar3;
  Logger *this_00;
  basic_formatter *this_01;
  ulong uVar4;
  aiTexture **ppaVar5;
  aiTexture *this_02;
  aiTexel *paVar6;
  allocator<char> local_651;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  aiString local_60c;
  aiTexture *local_208;
  aiTexture *tx;
  uint local_1f8;
  uint k;
  uint j;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  m3dtx_t *local_50;
  m3dtx_t *t;
  char *formatHint [4];
  uint local_1c;
  uint i;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  t = (m3dtx_t *)anon_var_dwarf_6cde23;
  formatHint[0] = "rgba0808";
  formatHint[1] = "rgba8880";
  formatHint[2] = "rgba8888";
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13c,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  bVar2 = M3DWrapper::operator_cast_to_bool(m3d);
  if (bVar2) {
    pmVar3 = M3DWrapper::operator->(m3d);
    this->mScene->mNumTextures = pmVar3->numtexture;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[21]>(&local_1e8,(char (*) [21])"M3D: importTextures ");
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1e8,&this->mScene->mNumTextures);
    Formatter::basic_formatter::operator_cast_to_string(&local_70,this_01);
    Logger::debug(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1e8);
    pmVar3 = M3DWrapper::operator->(m3d);
    if (pmVar3->numtexture != 0) {
      pmVar3 = M3DWrapper::operator->(m3d);
      auVar1 = ZEXT416(pmVar3->numtexture) * ZEXT816(8);
      uVar4 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      ppaVar5 = (aiTexture **)operator_new__(uVar4);
      this->mScene->mTextures = ppaVar5;
      for (local_1c = 0; pmVar3 = M3DWrapper::operator->(m3d), local_1c < pmVar3->numtexture;
          local_1c = local_1c + 1) {
        pmVar3 = M3DWrapper::operator->(m3d);
        local_50 = pmVar3->texture + local_1c;
        this_02 = (aiTexture *)operator_new(0x428);
        aiTexture::aiTexture(this_02);
        __s = local_50->name;
        local_208 = this_02;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,__s,&local_651);
        std::operator+(&local_630,&local_650,".png");
        aiString::aiString(&local_60c,&local_630);
        aiString::operator=(&local_208->mFilename,&local_60c);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_650);
        std::allocator<char>::~allocator(&local_651);
        if ((((local_50->w == 0) || (local_50->h == 0)) || (local_50->f == '\0')) ||
           (local_50->d == (uint8_t *)0x0)) {
          local_208->mWidth = 0;
          local_208->mHeight = 0;
          builtin_strncpy(local_208->achFormatHint,"png",4);
          local_208->pcData = (aiTexel *)0x0;
        }
        else {
          local_208->mWidth = (uint)local_50->w;
          local_208->mHeight = (uint)local_50->h;
          strcpy(local_208->achFormatHint,formatHint[(long)(int)(local_50->f - 1) + -1]);
          auVar1 = ZEXT416(local_208->mWidth * local_208->mHeight) * ZEXT816(4);
          uVar4 = auVar1._0_8_;
          if (auVar1._8_8_ != 0) {
            uVar4 = 0xffffffffffffffff;
          }
          paVar6 = (aiTexel *)operator_new__(uVar4);
          local_208->pcData = paVar6;
          tx._4_4_ = 0;
          for (local_1f8 = 0; local_1f8 < local_208->mWidth * local_208->mHeight;
              local_1f8 = local_1f8 + 1) {
            switch(local_50->f) {
            case '\x01':
              local_208->pcData[local_1f8].g = local_50->d[tx._4_4_];
              tx._4_4_ = tx._4_4_ + 1;
              break;
            case '\x02':
              local_208->pcData[local_1f8].g = local_50->d[tx._4_4_];
              local_208->pcData[local_1f8].a = local_50->d[tx._4_4_ + 1];
              tx._4_4_ = tx._4_4_ + 2;
              break;
            case '\x03':
              local_208->pcData[local_1f8].r = local_50->d[tx._4_4_];
              local_208->pcData[local_1f8].g = local_50->d[tx._4_4_ + 1];
              local_208->pcData[local_1f8].b = local_50->d[tx._4_4_ + 2];
              local_208->pcData[local_1f8].a = 0xff;
              tx._4_4_ = tx._4_4_ + 3;
              break;
            case '\x04':
              local_208->pcData[local_1f8].r = local_50->d[tx._4_4_];
              local_208->pcData[local_1f8].g = local_50->d[tx._4_4_ + 1];
              local_208->pcData[local_1f8].b = local_50->d[tx._4_4_ + 2];
              local_208->pcData[local_1f8].a = local_50->d[tx._4_4_ + 3];
              tx._4_4_ = tx._4_4_ + 4;
            }
          }
        }
        this->mScene->mTextures[local_1c] = local_208;
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x13d,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importTextures(const M3DWrapper &m3d) {
	unsigned int i;
	const char *formatHint[] = { "rgba0800", "rgba0808", "rgba8880", "rgba8888" };
	m3dtx_t *t;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumTextures = m3d->numtexture;
	ASSIMP_LOG_DEBUG_F("M3D: importTextures ", mScene->mNumTextures);

	if (!m3d->numtexture)
		return;

	mScene->mTextures = new aiTexture *[m3d->numtexture];
	for (i = 0; i < m3d->numtexture; i++) {
		unsigned int j, k;
		t = &m3d->texture[i];
		aiTexture *tx = new aiTexture;
		tx->mFilename = aiString(std::string(t->name) + ".png");
		if (!t->w || !t->h || !t->f || !t->d) {
			/* without ASSIMP_USE_M3D_READFILECB, we only have the filename, but no texture data ever */
			tx->mWidth = 0;
			tx->mHeight = 0;
			memcpy(tx->achFormatHint, "png\000", 4);
			tx->pcData = nullptr;
		} else {
			/* if we have the texture loaded, set format hint and pcData too */
			tx->mWidth = t->w;
			tx->mHeight = t->h;
			strcpy(tx->achFormatHint, formatHint[t->f - 1]);
			tx->pcData = new aiTexel[tx->mWidth * tx->mHeight];
			for (j = k = 0; j < tx->mWidth * tx->mHeight; j++) {
				switch (t->f) {
					case 1: tx->pcData[j].g = t->d[k++]; break;
					case 2:
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
					case 3:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = 255;
						break;
					case 4:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
				}
			}
		}
		mScene->mTextures[i] = tx;
	}
}